

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O3

Vec_Ptr_t * Bmc_MnaTernary(Gia_Man_t *p,int nFrames,int nFramesAdd,int fVerbose,int *iFirst)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  int iVar7;
  Vec_Ptr_t *pVVar8;
  void **ppvVar9;
  long lVar10;
  uint *puVar11;
  void *pvVar12;
  char *pcVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  byte bVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  timespec ts;
  ulong local_88;
  ulong local_70;
  timespec local_58;
  ulong local_48;
  ulong uStack_40;
  size_t local_38;
  
  uVar21 = p->vCos->nSize;
  iVar7 = clock_gettime(3,&local_58);
  if (iVar7 < 0) {
    lVar15 = 1;
  }
  else {
    lVar15 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_58.tv_nsec),8);
    lVar15 = ((lVar15 >> 7) - (lVar15 >> 0x3f)) + local_58.tv_sec * -1000000;
  }
  pGVar4 = p->pObjs;
  pGVar4->Value = 1;
  uVar22 = p->nRegs;
  uVar14 = (ulong)uVar22;
  pVVar5 = p->vCis;
  uVar1 = pVVar5->nSize;
  if (uVar1 - uVar22 != 0 && (int)uVar22 <= (int)uVar1) {
    uVar19 = 0;
    uVar20 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar20 = uVar19;
    }
    do {
      if (uVar20 == uVar19) goto LAB_005726bd;
      iVar7 = pVVar5->pArray[uVar19];
      if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) goto LAB_0057269e;
      pGVar4[iVar7].Value = 3;
      uVar19 = uVar19 + 1;
    } while (uVar1 - uVar22 != uVar19);
  }
  if (0 < (int)uVar22) {
    pVVar5 = p->vCos;
    iVar7 = pVVar5->nSize;
    uVar20 = (ulong)(iVar7 - uVar22);
    do {
      if (((int)uVar20 < 0) || (iVar7 <= (int)uVar20)) goto LAB_005726bd;
      iVar18 = pVVar5->pArray[uVar20];
      if (((long)iVar18 < 0) || (p->nObjs <= iVar18)) goto LAB_0057269e;
      pGVar4[iVar18].Value = 1;
      uVar20 = uVar20 + 1;
      uVar14 = uVar14 - 1;
    } while (uVar14 != 0);
  }
  *iFirst = -1;
  pVVar8 = (Vec_Ptr_t *)malloc(0x10);
  pVVar8->nCap = 100;
  pVVar8->nSize = 0;
  ppvVar9 = (void **)malloc(800);
  pVVar8->pArray = ppvVar9;
  local_38 = (long)(int)((((int)uVar21 >> 4) + 1) - (uint)((uVar21 & 0xf) == 0)) << 2;
  local_70 = 100;
  local_88 = 0;
  do {
    if ((nFrames == 0) && (-1 < *iFirst && (int)local_88 == *iFirst + nFramesAdd)) break;
    iVar7 = p->nRegs;
    lVar10 = (long)iVar7;
    if (lVar10 < 1) {
      uVar21 = p->nObjs;
      if (0 < (int)uVar21) goto LAB_005722a1;
    }
    else {
      pVVar5 = p->vCos;
      iVar18 = pVVar5->nSize;
      uVar14 = (ulong)(uint)(iVar18 - iVar7);
      iVar7 = -iVar7;
      do {
        if ((iVar18 + iVar7 < 0) || (iVar18 <= iVar18 + iVar7)) goto LAB_005726bd;
        iVar2 = pVVar5->pArray[uVar14];
        if (((long)iVar2 < 0) || (uVar21 = p->nObjs, (int)uVar21 <= iVar2)) goto LAB_0057269e;
        pGVar4 = p->pObjs;
        if (pGVar4 == (Gia_Obj_t *)0x0) goto LAB_00572344;
        iVar3 = p->vCis->nSize;
        uVar22 = iVar7 + iVar3;
        if (((int)uVar22 < 0) || (iVar3 <= (int)uVar22)) goto LAB_005726bd;
        uVar22 = p->vCis->pArray[uVar22];
        if (((long)(int)uVar22 < 0) || (uVar21 <= uVar22)) goto LAB_0057269e;
        pGVar4[(int)uVar22].Value = pGVar4[iVar2].Value;
        iVar7 = iVar7 + 1;
        uVar14 = uVar14 + 1;
        lVar10 = lVar10 + -1;
      } while (lVar10 != 0);
LAB_005722a1:
      uVar14 = (ulong)uVar21;
      if (p->pObjs != (Gia_Obj_t *)0x0) {
        puVar11 = &p->pObjs->Value;
        do {
          uVar20 = *(ulong *)(puVar11 + -2);
          if ((uVar20 & 0x1fffffff) != 0x1fffffff && -1 < (int)(uint)uVar20) {
            iVar7 = *(int *)((long)puVar11 + (ulong)(uint)((int)(uVar20 & 0x1fffffff) << 2) * -3);
            iVar18 = *(int *)((long)puVar11 + (ulong)((uint)(uVar20 >> 0x1e) & 0x7ffffffc) * -3);
            uVar21 = (iVar18 == 3 || iVar7 == 3) | 2;
            if (((uVar20 >> 0x3d & 1) != 0) + 1 == iVar18) {
              uVar21 = 1;
            }
            if ((((uint)uVar20 >> 0x1d & 1) != 0) + 1 == iVar7) {
              uVar21 = 1;
            }
            *puVar11 = uVar21;
          }
          puVar11 = puVar11 + 3;
          uVar14 = uVar14 - 1;
        } while (uVar14 != 0);
      }
    }
LAB_00572344:
    pvVar12 = malloc(local_38);
    pVVar5 = p->vCos;
    if (0 < pVVar5->nSize) {
      piVar6 = pVVar5->pArray;
      bVar17 = 0;
      uVar14 = 0;
      do {
        iVar7 = piVar6[uVar14];
        if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) goto LAB_0057269e;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar4 = p->pObjs + iVar7;
        uVar21 = ((((uint)*(undefined8 *)pGVar4 >> 0x1d & 1) != 0) + 1 !=
                 pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value) + 1;
        if (pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value == 3) {
          uVar21 = 3;
        }
        pGVar4->Value = uVar21;
        uVar20 = uVar14 >> 4 & 0xfffffff;
        uVar22 = *(uint *)((long)pvVar12 + uVar20 * 4);
        *(uint *)((long)pvVar12 + uVar20 * 4) =
             (uVar22 >> (bVar17 & 0x1e) & 3 ^ uVar21) << (bVar17 & 0x1e) ^ uVar22;
        iVar7 = pVVar5->nSize;
        if (((*iFirst == -1) && ((long)uVar14 < (long)iVar7 - (long)p->nRegs)) &&
           (pGVar4->Value == 3)) {
          *iFirst = (int)local_88;
          iVar7 = pVVar5->nSize;
        }
        uVar14 = uVar14 + 1;
        bVar17 = bVar17 + 2;
      } while ((long)uVar14 < (long)iVar7);
    }
    iVar7 = (int)local_70;
    if ((int)local_88 == iVar7) {
      if (iVar7 < 0x10) {
        if (pVVar8->pArray == (void **)0x0) {
          ppvVar9 = (void **)malloc(0x80);
        }
        else {
          ppvVar9 = (void **)realloc(pVVar8->pArray,0x80);
        }
        pVVar8->pArray = ppvVar9;
        pVVar8->nCap = 0x10;
        local_70 = 0x10;
      }
      else {
        local_70 = (ulong)(uint)(iVar7 * 2);
        if (pVVar8->pArray == (void **)0x0) {
          ppvVar9 = (void **)malloc(local_70 * 8);
        }
        else {
          ppvVar9 = (void **)realloc(pVVar8->pArray,local_70 * 8);
        }
        pVVar8->pArray = ppvVar9;
        pVVar8->nCap = iVar7 * 2;
      }
    }
    else {
      ppvVar9 = pVVar8->pArray;
    }
    uVar21 = (int)local_88 + 1;
    pVVar8->nSize = uVar21;
    ppvVar9[local_88] = pvVar12;
    if (fVerbose != 0) {
      local_48 = 0;
      uStack_40 = 0;
      iVar7 = p->nRegs;
      lVar10 = (long)iVar7;
      pVVar5 = p->vCos;
      iVar18 = pVVar5->nSize;
      if (lVar10 < 1) {
        uVar20 = 0;
        uVar19 = 0;
        uVar14 = 0;
      }
      else {
        uVar14 = (ulong)(uint)(iVar18 - iVar7);
        lVar16 = lVar10;
        do {
          if (((int)uVar14 < 0) || (iVar18 <= (int)uVar14)) goto LAB_005726bd;
          iVar2 = pVVar5->pArray[uVar14];
          if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_0057269e;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          piVar6 = (int *)((long)&local_48 + (ulong)p->pObjs[iVar2].Value * 4);
          *piVar6 = *piVar6 + 1;
          uVar14 = uVar14 + 1;
          lVar16 = lVar16 + -1;
        } while (lVar16 != 0);
        uVar14 = local_48 >> 0x20;
        uVar19 = uStack_40 & 0xffffffff;
        uVar20 = uStack_40 >> 0x20;
      }
      if (iVar18 <= iVar7) {
        __assert_fail("v < Gia_ManPoNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
      }
      if (iVar18 < 1) {
LAB_005726bd:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar7 = *pVVar5->pArray;
      if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) {
LAB_0057269e:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pcVar13 = "0";
      if (p->pObjs[iVar7].Value == 3) {
        pcVar13 = "x";
      }
      printf("%5d : 0 =%7d    1 =%7d    x =%7d    all =%7d   out = %s\n",local_88,uVar14,uVar19,
             uVar20,lVar10,pcVar13);
    }
    local_88 = (ulong)uVar21;
  } while (uVar21 != nFrames || nFrames == 0);
  if (fVerbose != 0) {
    printf("Finished %d frames. First x-valued PO is in frame %d.  ",(ulong)(uint)nFrames,
           (ulong)(uint)*iFirst);
    iVar18 = 3;
    iVar7 = clock_gettime(3,&local_58);
    if (iVar7 < 0) {
      lVar10 = -1;
    }
    else {
      lVar10 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
    }
    Abc_Print(iVar18,"%s =","Time");
    Abc_Print(iVar18,"%9.2f sec\n",SUB84((double)(lVar10 + lVar15) / 1000000.0,0));
  }
  return pVVar8;
}

Assistant:

Vec_Ptr_t * Bmc_MnaTernary( Gia_Man_t * p, int nFrames, int nFramesAdd, int fVerbose, int * iFirst )
{
    Vec_Ptr_t * vStates;
    unsigned * pState;
    int nStateWords = Abc_BitWordNum( 2*Gia_ManCoNum(p) );
    Gia_Obj_t * pObj, * pObjRo;
    int f, i, Count[4];
    abctime clk = Abc_Clock();
    Gia_ManConst0(p)->Value = GIA_ZER;
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = GIA_UND;
    Gia_ManForEachRi( p, pObj, i )
        pObj->Value = GIA_ZER;
    *iFirst = -1;
    vStates = Vec_PtrAlloc( 100 );
    for ( f = 0; ; f++ )
    {
        // if frames are given, break at frames
        if ( nFrames && f == nFrames )
            break;
        // if frames are not given, break after nFramesAdd from the first x-valued
        if ( !nFrames && *iFirst >= 0 && f == *iFirst + nFramesAdd )
            break;
        // aassign CI values
        Gia_ManForEachRiRo( p, pObj, pObjRo, i )
            pObjRo->Value = pObj->Value;
        Gia_ManForEachAnd( p, pObj, i )
            pObj->Value = Gia_XsimAndCond( Gia_ObjFanin0(pObj)->Value, Gia_ObjFaninC0(pObj), Gia_ObjFanin1(pObj)->Value, Gia_ObjFaninC1(pObj) );
        // compute and save CO values
        pState = ABC_ALLOC( unsigned, nStateWords );
        Gia_ManForEachCo( p, pObj, i )
        {
            pObj->Value = Gia_XsimNotCond( Gia_ObjFanin0(pObj)->Value, Gia_ObjFaninC0(pObj) );
            Gia_ManTerSimInfoSet( pState, i, pObj->Value );
            if ( *iFirst == -1 && i < Gia_ManPoNum(p) && pObj->Value == GIA_UND )
                *iFirst = f;
        }
        Vec_PtrPush( vStates, pState );
        // print statistics
        if ( !fVerbose )
            continue;
        Count[0] = Count[1] = Count[2] = Count[3] = 0;
        Gia_ManForEachRi( p, pObj, i )
            Count[pObj->Value]++;
        printf( "%5d : 0 =%7d    1 =%7d    x =%7d    all =%7d   out = %s\n", 
            f, Count[GIA_ZER], Count[GIA_ONE], Count[GIA_UND], Gia_ManRegNum(p), 
            Gia_ManPo(p, 0)->Value == GIA_UND ? "x" : "0" );  
    }
//    assert( Vec_PtrSize(vStates) == nFrames );
    if ( fVerbose )
        printf( "Finished %d frames. First x-valued PO is in frame %d.  ", nFrames, *iFirst );
    if ( fVerbose )
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return vStates;
}